

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.cpp
# Opt level: O0

void gcm_incr(uchar *y)

{
  uint uVar1;
  uint32_t x;
  uchar *y_local;
  uint32_t r;
  
  uVar1 = *(uint *)(y + 0xc);
  uVar1 = (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18) + 1;
  *(uint *)(y + 0xc) =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 * 0x1000000;
  return;
}

Assistant:

static void gcm_incr(unsigned char y[16])
{
    uint32_t x = MBEDTLS_GET_UINT32_BE(y, 12);
    x++;
    MBEDTLS_PUT_UINT32_BE(x, y, 12);
}